

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

Try<tl::expected<void,_std::errc>_> * __thiscall
async_simple::coro::detail::LazyPromise<tl::expected<void,_std::errc>_>::tryResult
          (LazyPromise<tl::expected<void,_std::errc>_> *this)

{
  bool bVar1;
  expected<void,_std::errc> *value;
  Try<tl::expected<void,_std::errc>_> *in_RDI;
  exception_ptr *in_stack_ffffffffffffffb8;
  Try<tl::expected<void,_std::errc>_> *in_stack_ffffffffffffffc0;
  Try<tl::expected<void,_std::errc>_> *this_00;
  Try<tl::expected<void,_std::errc>_> local_18;
  
  bVar1 = std::
          holds_alternative<std::__exception_ptr::exception_ptr,std::monostate,tl::expected<void,std::errc>,std::__exception_ptr::exception_ptr>
                    ((variant<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
                      *)0x35166e);
  if (bVar1) {
    std::
    get<std::__exception_ptr::exception_ptr,std::monostate,tl::expected<void,std::errc>,std::__exception_ptr::exception_ptr>
              ((variant<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
                *)0x351682);
    this_00 = &local_18;
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)this_00,in_stack_ffffffffffffffb8);
    Try<tl::expected<void,_std::errc>_>::Try(this_00,in_stack_ffffffffffffffb8);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_00);
  }
  else {
    value = std::
            get<tl::expected<void,std::errc>,std::monostate,tl::expected<void,std::errc>,std::__exception_ptr::exception_ptr>
                      ((variant<std::monostate,_tl::expected<void,_std::errc>,_std::__exception_ptr::exception_ptr>
                        *)0x3516c8);
    Try<tl::expected<void,_std::errc>_>::Try<tl::expected<void,_std::errc>_>
              (in_stack_ffffffffffffffc0,value);
  }
  return in_RDI;
}

Assistant:

Try<T> tryResult() noexcept {
        if (std::holds_alternative<std::exception_ptr>(_value))
            AS_UNLIKELY { return Try<T>(std::get<std::exception_ptr>(_value)); }